

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jstdhuff.c
# Opt level: O0

void add_huff_table(j_common_ptr cinfo,JHUFF_TBL **htblptr,UINT8 *bits,UINT8 *val)

{
  undefined8 *puVar1;
  JHUFF_TBL *pJVar2;
  j_common_ptr in_RCX;
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int len;
  int nsymbols;
  int local_28;
  int local_24;
  
  if (*in_RSI == 0) {
    pJVar2 = jpeg_alloc_huff_table(in_RCX);
    *in_RSI = (long)pJVar2;
    puVar1 = (undefined8 *)*in_RSI;
    *puVar1 = *in_RDX;
    puVar1[1] = in_RDX[1];
    *(undefined1 *)(puVar1 + 2) = *(undefined1 *)(in_RDX + 2);
    local_24 = 0;
    for (local_28 = 1; local_28 < 0x11; local_28 = local_28 + 1) {
      local_24 = (uint)*(byte *)((long)in_RDX + (long)local_28) + local_24;
    }
    if ((local_24 < 1) || (0x100 < local_24)) {
      *(undefined4 *)(*in_RDI + 0x28) = 8;
      (**(code **)*in_RDI)(in_RDI);
    }
    memcpy((void *)(*in_RSI + 0x11),in_RCX,(long)local_24);
    memset((void *)(*in_RSI + 0x11 + (long)local_24),0,(long)(0x100 - local_24));
    *(undefined4 *)(*in_RSI + 0x114) = 0;
  }
  return;
}

Assistant:

LOCAL(void)
add_huff_table(j_common_ptr cinfo, JHUFF_TBL **htblptr, const UINT8 *bits,
               const UINT8 *val)
/* Define a Huffman table */
{
  int nsymbols, len;

  if (*htblptr == NULL)
    *htblptr = jpeg_alloc_huff_table(cinfo);
  else
    return;

  /* Copy the number-of-symbols-of-each-code-length counts */
  MEMCOPY((*htblptr)->bits, bits, sizeof((*htblptr)->bits));

  /* Validate the counts.  We do this here mainly so we can copy the right
   * number of symbols from the val[] array, without risking marching off
   * the end of memory.  jchuff.c will do a more thorough test later.
   */
  nsymbols = 0;
  for (len = 1; len <= 16; len++)
    nsymbols += bits[len];
  if (nsymbols < 1 || nsymbols > 256)
    ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);

  MEMCOPY((*htblptr)->huffval, val, nsymbols * sizeof(UINT8));
  MEMZERO(&((*htblptr)->huffval[nsymbols]), (256 - nsymbols) * sizeof(UINT8));

  /* Initialize sent_table FALSE so table will be written to JPEG file. */
  (*htblptr)->sent_table = FALSE;
}